

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O0

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U> *this,deUintptr newSize)

{
  BuildSpirVAsmTask *pBVar1;
  ulong local_30;
  deUintptr ndx_1;
  deUintptr prevSize;
  deUintptr ndx;
  deUintptr newSize_local;
  PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U> *this_local;
  
  prevSize = newSize;
  if (newSize < this->m_numElements) {
    for (; prevSize < this->m_numElements; prevSize = prevSize + 1) {
      pBVar1 = getPtr(this,prevSize);
      PoolArrayElement<vkt::(anonymous_namespace)::BuildSpirVAsmTask>::destruct(pBVar1);
    }
    this->m_numElements = newSize;
  }
  else if (this->m_numElements < newSize) {
    local_30 = this->m_numElements;
    reserve(this,newSize);
    this->m_numElements = newSize;
    for (; local_30 < this->m_numElements; local_30 = local_30 + 1) {
      pBVar1 = getPtr(this,local_30);
      PoolArrayElement<vkt::(anonymous_namespace)::BuildSpirVAsmTask>::constructDefault(pBVar1);
    }
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}